

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

void Abc_BufPrintOne(Buf_Man_t *p,int iPivot)

{
  Abc_Ntk_t *pNtk;
  int i;
  uint uVar1;
  Abc_Obj_t *pObj;
  Vec_Int_t *p_00;
  Abc_Obj_t *pFan;
  int i_00;
  
  pObj = Abc_NtkObj(p->pNtk,iPivot);
  p_00 = Abc_BufSortByDelay(p,iPivot);
  printf("Node %5d  Fi = %d  Fo = %3d  Lev = %3d : {",iPivot,(ulong)(uint)(pObj->vFanins).nSize,
         (ulong)(uint)(pObj->vFanouts).nSize,(ulong)(*(uint *)&pObj->field_0x14 >> 0xc));
  for (i_00 = 0; i_00 < p_00->nSize; i_00 = i_00 + 1) {
    pNtk = p->pNtk;
    i = Vec_IntEntry(p_00,i_00);
    pFan = Abc_NtkObj(pNtk,i);
    if (pFan != (Abc_Obj_t *)0x0) {
      uVar1 = Abc_BufEdgeSlack(p,pObj,pFan);
      printf(" %d(%d)",(ulong)(uint)pFan->Id,(ulong)uVar1);
    }
  }
  puts(" }");
  return;
}

Assistant:

void Abc_BufPrintOne( Buf_Man_t * p, int iPivot )
{
    Abc_Obj_t * pObj, * pFanout;
    Vec_Int_t * vOrder;
    int i, Slack;
    pObj = Abc_NtkObj( p->pNtk, iPivot );
    vOrder = Abc_BufSortByDelay( p, iPivot );
    printf( "Node %5d  Fi = %d  Fo = %3d  Lev = %3d : {", iPivot, Abc_ObjFaninNum(pObj), Abc_ObjFanoutNum(pObj), Abc_ObjLevel(pObj) );
    Abc_NtkForEachObjVec( vOrder, p->pNtk, pFanout, i )
    {
        Slack = Abc_BufEdgeSlack( p, pObj, pFanout );
        printf( " %d(%d)", Abc_ObjId(pFanout), Slack );
    }
    printf( " }\n" );
}